

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanDocEnd(Scanner *this)

{
  int iVar1;
  undefined8 uVar2;
  Token local_70;
  
  PopAllIndents(this);
  PopAllSimpleKeys(this);
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = false;
  uVar2._0_4_ = (this->INPUT).m_mark.pos;
  uVar2._4_4_ = (this->INPUT).m_mark.line;
  iVar1 = (this->INPUT).m_mark.column;
  YAML::Stream::eat(&this->INPUT,3);
  local_70.value._M_dataplus._M_p = (pointer)&local_70.value.field_2;
  local_70.status = VALID;
  local_70.type = DOC_END;
  local_70.value._M_string_length = 0;
  local_70.value.field_2._M_local_buf[0] = '\0';
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_70._76_8_ = 0;
  local_70.mark._0_8_ = uVar2;
  local_70.mark.column = iVar1;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,&local_70);
  Token::~Token(&local_70);
  return;
}

Assistant:

void Scanner::ScanDocEnd() {
  PopAllIndents();
  PopAllSimpleKeys();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(3);
  m_tokens.push(Token(Token::DOC_END, mark));
}